

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ghosts.c
# Opt level: O0

logical pnga_set_ghost_info(Integer g_a)

{
  long lVar1;
  long in_RDI;
  Integer handle;
  Integer in_stack_00000f18;
  logical local_8;
  
  lVar1 = in_RDI + 1000;
  if (GA[lVar1].cache != (double *)0x0) {
    free(GA[lVar1].cache);
  }
  GA[lVar1].cache = (double *)0x0;
  if (GA[lVar1].actv == 1) {
    local_8 = pnga_set_update4_info(in_stack_00000f18);
  }
  else {
    local_8 = 1;
  }
  return local_8;
}

Assistant:

logical pnga_set_ghost_info(Integer g_a)
{
  Integer handle = g_a + GA_OFFSET;
  if (GA[handle].cache != NULL)
    free(GA[handle].cache);
  GA[handle].cache = NULL;
  if (GA[handle].actv == 1) {
    return pnga_set_update4_info(g_a);
  }
  return TRUE;
}